

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_TestNonZeroIntMapEntriesHaveNoPresence_Test::
~NoFieldPresenceTest_TestNonZeroIntMapEntriesHaveNoPresence_Test
          (NoFieldPresenceTest_TestNonZeroIntMapEntriesHaveNoPresence_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroIntMapEntriesHaveNoPresence) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_enum =
      desc->FindFieldByName("map_int32_foreign_enum");

  // Set nonzero values for key-value pairs and test that.
  (*message.mutable_map_int32_foreign_enum())[99] = FOREIGN_BAZ;

  const google::protobuf::Message& enum_map_entry =
      r->GetRepeatedMessage(message, field_map_int32_foreign_enum, /*index=*/0);

  // Fields in map entries inherit field_presence from file defaults. If a map
  // is a "no presence" field, its key is also considered "no presence" from POV
  // of the descriptor. (Even though the key itself behaves like a normal index
  // with zeroes being valid indices). One day we will change this...
  EXPECT_THAT(enum_map_entry, Not(MapEntryKeyExplicitPresence()));

  // Primitive types inherit presence semantics from the map itself.
  EXPECT_THAT(enum_map_entry, Not(MapEntryValueExplicitPresence()));
}